

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

void __thiscall
pstore::sparse_array<int,unsigned_short>::
sparse_array<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (sparse_array<int,unsigned_short> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          first_index,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          last_index,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_value,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_value)

{
  bool bVar1;
  unsigned_short uVar2;
  reference piVar3;
  bool local_59;
  sparse_array<int,unsigned_short> *local_50;
  int *out;
  unsigned_long *local_40;
  unsigned_long *local_38;
  sparse_array<int,unsigned_short> *local_30;
  sparse_array<int,_unsigned_short> *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_value_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_value_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  last_index_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  first_index_local;
  
  local_40 = last_index._M_current;
  local_38 = first_index._M_current;
  local_30 = this;
  this_local = (sparse_array<int,_unsigned_short> *)last_value._M_current;
  last_value_local = first_value;
  first_value_local._M_current = (int *)last_index._M_current;
  last_index_local = first_index;
  uVar2 = bitmap<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                    (first_index,last_index);
  *(unsigned_short *)this = uVar2;
  bVar1 = __gnu_cxx::operator!=
                    (&last_index_local,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)&first_value_local);
  if (bVar1) {
    bVar1 = __gnu_cxx::operator!=
                      (&last_value_local,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &this_local);
    if (bVar1) {
      out = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator++(&last_value_local,0);
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&out);
      *(int *)(this + 4) = *piVar3;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&last_index_local);
  }
  local_50 = this + 8;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&last_index_local,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&first_value_local);
    local_59 = false;
    if (bVar1) {
      local_59 = __gnu_cxx::operator!=
                           (&last_value_local,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            &this_local);
    }
    if (local_59 == false) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&last_value_local);
    *(int *)local_50 = *piVar3;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&last_index_local);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&last_value_local);
    local_50 = local_50 + 4;
  }
  while (bVar1 = __gnu_cxx::operator!=
                           (&last_index_local,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)&first_value_local), bVar1) {
    *(int *)local_50 = 0;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&last_index_local);
    local_50 = local_50 + 4;
  }
  return;
}

Assistant:

sparse_array<ValueType, BitmapType>::sparse_array (IteratorIdx first_index,
                                                       IteratorIdx last_index,
                                                       IteratorV first_value, IteratorV last_value)
            : bitmap_{bitmap (first_index, last_index)} {

        // Deal with the first element. This is the odd-one-out becuase it's in the
        // declaration of the object and will have been default-constructed by the
        // compiler.
        if (first_index != last_index) {
            if (first_value != last_value) {
                elements_[0] = *(first_value++);
            }
            ++first_index;
        }

        auto out = &elements_[1];

        // Now construct any remaining elements into the uninitialized memory past the
        // end of the object using placement new.
        for (; first_index != last_index && first_value != last_value;
             ++first_index, ++first_value, ++out) {
            new (out) ValueType (*first_value);
        }
        // Default-construct any remaining objects for which we don't have a value.
        for (; first_index != last_index; ++first_index, ++out) {
            new (out) ValueType ();
        }
    }